

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetInstallNameDirForBuildTree
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  cmMakefile *pcVar1;
  bool bVar2;
  allocator local_8b;
  allocator local_8a;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string
            ((string *)&local_88,"BUILD_WITH_INSTALL_RPATH",(allocator *)&local_68);
  bVar2 = GetPropertyAsBool(this,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  if (bVar2) {
    GetInstallNameDirForInstallTree_abi_cxx11_(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&local_88,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_89);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_88);
  if (bVar2) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string((string *)&local_68,"CMAKE_SKIP_RPATH",&local_8a);
    bVar2 = cmMakefile::IsOn(pcVar1,&local_68);
    if (!bVar2) {
      std::__cxx11::string::string((string *)&local_48,"SKIP_BUILD_RPATH",&local_8b);
      bVar2 = GetPropertyAsBool(this,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      if (!bVar2) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        bVar2 = MacOSXRpathInstallNameDirDefault(this);
        if (bVar2) {
          std::__cxx11::string::assign((char *)__return_storage_ptr__);
        }
        else {
          GetDirectory(&local_88,this,config,false);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
          std::__cxx11::string::~string((string *)&local_88);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      goto LAB_0036517c;
    }
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::~string((string *)&local_88);
LAB_0036517c:
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmGeneratorTarget::GetInstallNameDirForBuildTree(
                                            const std::string& config) const
{
  // If building directly for installation then the build tree install_name
  // is the same as the install tree.
  if(this->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"))
    {
    return this->GetInstallNameDirForInstallTree();
    }

  // Use the build tree directory for the target.
  if(this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME") &&
     !this->Makefile->IsOn("CMAKE_SKIP_RPATH") &&
     !this->GetPropertyAsBool("SKIP_BUILD_RPATH"))
    {
    std::string dir;
    if(this->MacOSXRpathInstallNameDirDefault())
      {
      dir = "@rpath";
      }
    else
      {
      dir = this->GetDirectory(config);
      }
    dir += "/";
    return dir;
    }
  else
    {
    return "";
    }
}